

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino_http.c
# Opt level: O0

void not_found(int client)

{
  int iVar1;
  char *pcStack_18;
  int bytes;
  char *buffer;
  int client_local;
  
  pcStack_18 = (char *)0x0;
  buffer._4_4_ = client;
  iVar1 = asprintf(&stack0xffffffffffffffe8,"HTTP/1.0 404 NOT FOUND\r\n");
  send_free(buffer._4_4_,&stack0xffffffffffffffe8,iVar1);
  iVar1 = asprintf(&stack0xffffffffffffffe8,"Server: dinohttp/0.1\r\n");
  send_free(buffer._4_4_,&stack0xffffffffffffffe8,iVar1);
  iVar1 = asprintf(&stack0xffffffffffffffe8,"Content-Type: text/html\r\n");
  send_free(buffer._4_4_,&stack0xffffffffffffffe8,iVar1);
  iVar1 = asprintf(&stack0xffffffffffffffe8,"\r\n");
  send_free(buffer._4_4_,&stack0xffffffffffffffe8,iVar1);
  iVar1 = asprintf(&stack0xffffffffffffffe8,"<HTML><TITLE>Not Found</TITLE>\r\n");
  send_free(buffer._4_4_,&stack0xffffffffffffffe8,iVar1);
  iVar1 = asprintf(&stack0xffffffffffffffe8,"<BODY><P>The server could not fulfill\r\n");
  send_free(buffer._4_4_,&stack0xffffffffffffffe8,iVar1);
  iVar1 = asprintf(&stack0xffffffffffffffe8,"your request because the resource specified\r\n");
  send_free(buffer._4_4_,&stack0xffffffffffffffe8,iVar1);
  iVar1 = asprintf(&stack0xffffffffffffffe8,"is unavailable or nonexistent.\r\n");
  send_free(buffer._4_4_,&stack0xffffffffffffffe8,iVar1);
  iVar1 = asprintf(&stack0xffffffffffffffe8,"</BODY></HTML>\r\n");
  send_free(buffer._4_4_,&stack0xffffffffffffffe8,iVar1);
  return;
}

Assistant:

void not_found(int client) {
    char *buffer = NULL;

    int bytes = asprintf(&buffer, "HTTP/1.0 404 NOT FOUND\r\n");
    send_free(client, &buffer, bytes);;

    bytes = asprintf(&buffer, DINO_VERSION);
    send_free(client, &buffer, bytes);;

    bytes = asprintf(&buffer, "Content-Type: text/html\r\n");
    send_free(client, &buffer, bytes);;

    bytes = asprintf(&buffer, "\r\n");
    send_free(client, &buffer, bytes);;

    bytes = asprintf(&buffer, "<HTML><TITLE>Not Found</TITLE>\r\n");
    send_free(client, &buffer, bytes);;

    bytes = asprintf(&buffer, "<BODY><P>The server could not fulfill\r\n");
    send_free(client, &buffer, bytes);;

    bytes = asprintf(&buffer, "your request because the resource specified\r\n");
    send_free(client, &buffer, bytes);;

    bytes = asprintf(&buffer, "is unavailable or nonexistent.\r\n");
    send_free(client, &buffer, bytes);;

    bytes = asprintf(&buffer, "</BODY></HTML>\r\n");
    send_free(client, &buffer, bytes);;
}